

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

ostream * anon_unknown.dwarf_f6f6::operator<<(ostream *os,PrettyTime *rhs)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  rep rVar4;
  ostream *poVar5;
  ostream *this;
  rep *in_RSI;
  ostream *in_RDI;
  seconds t;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff48;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff50;
  duration<long,_std::ratio<1L,_1L>_> local_60;
  int local_58;
  char local_51;
  duration<long,_std::ratio<60L,_1L>_> local_50;
  duration<long,_std::ratio<60L,_1L>_> local_48;
  int local_40;
  char local_39;
  duration<long,_std::ratio<3600L,_1L>_> local_38;
  int local_2c;
  duration<long,std::ratio<3600l,1l>> local_28 [8];
  rep local_20;
  duration<long,_std::ratio<1L,_1L>_> local_18 [2];
  ostream *local_8;
  
  local_18[0].__r = *in_RSI;
  local_8 = in_RDI;
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(local_18);
  if (rVar4 < 0) {
    std::operator<<(local_8,'-');
    local_20 = -1;
    std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator*=(local_18,&local_20);
  }
  local_2c = 1;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_28,&local_2c);
  bVar1 = std::chrono::operator>=
                    (in_stack_ffffffffffffff50,
                     (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffff48);
  poVar5 = local_8;
  if (bVar1) {
    local_38.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<3600l,1l>>,long,std::ratio<1l,1l>>
                                  (in_stack_ffffffffffffff48);
    rVar4 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_38);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar4);
    poVar5 = std::operator<<(poVar5,'h');
    local_39 = (char)std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,local_39);
    local_40 = (int)std::setw(2);
    poVar5 = std::operator<<(poVar5,(_Setw)local_40);
    local_48.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1l>>
                                  (in_stack_ffffffffffffff48);
    rVar4 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_48);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar4 % 0x3c);
    std::operator<<(poVar5,'m');
  }
  else {
    local_50.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1l>>
                                  (in_stack_ffffffffffffff48);
    rVar4 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_50);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar4);
    poVar5 = std::operator<<(poVar5,'m');
    local_51 = (char)std::setfill<char>('0');
    std::operator<<(poVar5,local_51);
  }
  poVar5 = local_8;
  local_58 = (int)std::setw(2);
  this = std::operator<<(poVar5,(_Setw)local_58);
  local_60.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1l>>
                                ((duration<long,_std::ratio<1L,_1L>_> *)poVar5);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_60);
  poVar5 = (ostream *)std::ostream::operator<<(this,rVar4 % 0x3c);
  poVar5 = std::operator<<(poVar5,'s');
  _Var3 = std::setw(0);
  poVar5 = std::operator<<(poVar5,_Var3);
  _Var2 = std::setfill<char>(' ');
  std::operator<<(poVar5,_Var2._M_c);
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const PrettyTime &rhs)
{
    using hours = std::chrono::hours;
    using minutes = std::chrono::minutes;

    seconds t{rhs.mTime};
    if(t.count() < 0)
    {
        os << '-';
        t *= -1;
    }

    // Only handle up to hour formatting
    if(t >= hours{1})
        os << duration_cast<hours>(t).count() << 'h' << std::setfill('0') << std::setw(2)
           << (duration_cast<minutes>(t).count() % 60) << 'm';
    else
        os << duration_cast<minutes>(t).count() << 'm' << std::setfill('0');
    os << std::setw(2) << (duration_cast<seconds>(t).count() % 60) << 's' << std::setw(0)
       << std::setfill(' ');
    return os;
}